

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void PushMultiItemsWidths(int components,float w_full)

{
  value_type_conflict1 *pvVar1;
  int local_2c;
  float local_28;
  int i;
  float w_item_last;
  float w_item_one;
  ImGuiStyle *style;
  ImGuiWindow *window;
  float w_full_local;
  int components_local;
  
  window._0_4_ = w_full;
  window._4_4_ = components;
  style = (ImGuiStyle *)ImGui::GetCurrentWindow();
  _w_item_last = &GImGui->Style;
  if (window._0_4_ <= 0.0) {
    window._0_4_ = ImGui::CalcItemWidth();
  }
  i = (int)ImMax(1.0,(float)(int)((-(_w_item_last->ItemInnerSpacing).x * (float)(window._4_4_ + -1)
                                  + window._0_4_) / (float)window._4_4_));
  local_28 = ImMax(1.0,(float)(int)(-((float)i + (_w_item_last->ItemInnerSpacing).x) *
                                    (float)(window._4_4_ + -1) + window._0_4_));
  ImVector<float>::push_back((ImVector<float> *)&style->Colors[0xc].w,&local_28);
  for (local_2c = 0; local_2c < window._4_4_ + -1; local_2c = local_2c + 1) {
    ImVector<float>::push_back((ImVector<float> *)&style->Colors[0xc].w,(value_type_conflict1 *)&i);
  }
  pvVar1 = ImVector<float>::back((ImVector<float> *)&style->Colors[0xc].w);
  style->Colors[0xc].x = *pvVar1;
  return;
}

Assistant:

static void PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = ImGui::GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = ImGui::CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}